

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

void luaT_getvarargs(lua_State *L,CallInfo *ci,StkId where,int wanted)

{
  StkId pSVar1;
  long lVar2;
  ulong uVar3;
  lu_byte *plVar4;
  long lVar5;
  uint n;
  
  n = (ci->u).l.nextraargs;
  lVar5 = (long)(int)n;
  if (wanted < 0) {
    if ((long)(L->stack_last).p - (L->top).offset >> 4 <= lVar5) {
      lVar2 = (L->stack).offset;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,n,1);
      where = (StkId)(((long)where - lVar2) + (long)(L->stack).p);
    }
    (L->top).p = where + lVar5;
    wanted = n;
  }
  if (wanted < (int)n) {
    n = wanted;
  }
  if ((int)n < 1) {
    uVar3 = 0;
  }
  else {
    lVar5 = lVar5 * -0x10;
    plVar4 = &(where->val).tt_;
    uVar3 = 0;
    do {
      pSVar1 = (ci->func).p;
      ((TValue *)(plVar4 + -8))->value_ = *(Value *)((long)pSVar1 + lVar5);
      *plVar4 = *(lu_byte *)((long)pSVar1 + lVar5 + 8);
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 0x10;
      plVar4 = plVar4 + 0x10;
    } while (n != uVar3);
  }
  if ((int)uVar3 < wanted) {
    lVar5 = (ulong)(uint)wanted - (uVar3 & 0xffffffff);
    plVar4 = &(&where->val)[uVar3 & 0xffffffff].tt_;
    do {
      *plVar4 = '\0';
      plVar4 = plVar4 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void luaT_getvarargs (lua_State *L, CallInfo *ci, StkId where, int wanted) {
  int i;
  int nextra = ci->u.l.nextraargs;
  if (wanted < 0) {
    wanted = nextra;  /* get all extra arguments available */
    checkstackGCp(L, nextra, where);  /* ensure stack space */
    L->top.p = where + nextra;  /* next instruction will need top */
  }
  for (i = 0; i < wanted && i < nextra; i++)
    setobjs2s(L, where + i, ci->func.p - nextra + i);
  for (; i < wanted; i++)   /* complete required results with nil */
    setnilvalue(s2v(where + i));
}